

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

void __thiscall ED::ED(ED *this,ED *cpyObj)

{
  Mat local_90 [96];
  
  (this->segmentPoints).
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segmentPoints).
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segmentPoints).
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::Mat::Mat(&this->smoothImage);
  cv::Mat::Mat(&this->srcImage);
  (this->edgePoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edgePoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->anchorPoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edgePoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->anchorPoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->anchorPoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Mat::Mat(&this->edgeImage);
  cv::Mat::Mat(&this->gradImage);
  this->height = cpyObj->height;
  this->width = cpyObj->width;
  cv::Mat::clone();
  cv::Mat::operator=(&this->srcImage,local_90);
  cv::Mat::~Mat(local_90);
  this->op = cpyObj->op;
  this->gradThresh = cpyObj->gradThresh;
  this->anchorThresh = cpyObj->anchorThresh;
  this->scanInterval = cpyObj->scanInterval;
  this->minPathLen = cpyObj->minPathLen;
  this->sigma = cpyObj->sigma;
  this->sumFlag = cpyObj->sumFlag;
  cv::Mat::clone();
  cv::Mat::operator=(&this->edgeImage,local_90);
  cv::Mat::~Mat(local_90);
  cv::Mat::clone();
  cv::Mat::operator=(&this->smoothImage,local_90);
  cv::Mat::~Mat(local_90);
  cv::Mat::clone();
  cv::Mat::operator=(&this->gradImage,local_90);
  cv::Mat::~Mat(local_90);
  this->srcImg = *(uchar **)&this->field_0xb8;
  this->smoothImg = *(uchar **)&this->field_0x40;
  this->gradImg = *(short **)&this->field_0x1b0;
  this->edgeImg = *(uchar **)&this->field_0x150;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::operator=(&this->segmentPoints,&cpyObj->segmentPoints);
  this->segmentNos = cpyObj->segmentNos;
  return;
}

Assistant:

ED::ED(const ED & cpyObj)
{
	height = cpyObj.height;
	width = cpyObj.width;

	srcImage = cpyObj.srcImage.clone();
	
	op = cpyObj.op;
	gradThresh = cpyObj.gradThresh;
	anchorThresh = cpyObj.anchorThresh;
	scanInterval = cpyObj.scanInterval;
	minPathLen = cpyObj.minPathLen;
	sigma = cpyObj.sigma;
	sumFlag = cpyObj.sumFlag;

	edgeImage = cpyObj.edgeImage.clone();
	smoothImage = cpyObj.smoothImage.clone();
	gradImage = cpyObj.gradImage.clone();

	srcImg = srcImage.data;

	smoothImg = smoothImage.data;
	gradImg = (short*)gradImage.data;
	edgeImg = edgeImage.data;

	segmentPoints = cpyObj.segmentPoints;
	segmentNos = cpyObj.segmentNos;
}